

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLcode multi_reconnect_request(Curl_easy *data)

{
  _Bool local_2a;
  _Bool local_29;
  _Bool protocol_done;
  connectdata *pcStack_28;
  _Bool async;
  connectdata *conn;
  Curl_easy *pCStack_18;
  CURLcode result;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  pcStack_28 = data->conn;
  pCStack_18 = data;
  Curl_infof(data,"Re-used connection seems dead, get a new one\n");
  Curl_conncontrol(pcStack_28,1);
  conn._4_4_ = multi_done(pCStack_18,conn._4_4_,false);
  if ((conn._4_4_ == CURLE_OK) || (conn._4_4_ == CURLE_SEND_ERROR)) {
    local_2a = true;
    conn._4_4_ = Curl_connect(pCStack_18,&local_29,&local_2a);
    if ((conn._4_4_ == CURLE_OK) && (pcStack_28 = pCStack_18->conn, (local_29 & 1U) != 0)) {
      conn._4_4_ = Curl_resolver_wait_resolv(pcStack_28,(Curl_dns_entry **)0x0);
      if (conn._4_4_ != CURLE_OK) {
        return conn._4_4_;
      }
      conn._4_4_ = Curl_once_resolved(pcStack_28,&local_2a);
      if (conn._4_4_ != CURLE_OK) {
        return conn._4_4_;
      }
    }
  }
  return conn._4_4_;
}

Assistant:

static CURLcode multi_reconnect_request(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  /* This was a re-use of a connection and we got a write error in the
   * DO-phase. Then we DISCONNECT this connection and have another attempt to
   * CONNECT and then DO again! The retry cannot possibly find another
   * connection to re-use, since we only keep one possible connection for
   * each.  */

  infof(data, "Re-used connection seems dead, get a new one\n");

  connclose(conn, "Reconnect dead connection"); /* enforce close */
  result = multi_done(data, result, FALSE); /* we are so done with this */

  /* data->conn was detached in multi_done() */

  /*
   * We need to check for CURLE_SEND_ERROR here as well. This could happen
   * when the request failed on a FTP connection and thus multi_done() itself
   * tried to use the connection (again).
   */
  if(!result || (CURLE_SEND_ERROR == result)) {
    bool async;
    bool protocol_done = TRUE;

    /* Now, redo the connect and get a new connection */
    result = Curl_connect(data, &async, &protocol_done);
    if(!result) {
      /* We have connected or sent away a name resolve query fine */

      conn = data->conn; /* in case it was updated */
      if(async) {
        /* Now, if async is TRUE here, we need to wait for the name
           to resolve */
        result = Curl_resolver_wait_resolv(conn, NULL);
        if(result)
          return result;

        /* Resolved, continue with the connection */
        result = Curl_once_resolved(conn, &protocol_done);
        if(result)
          return result;
      }
    }
  }

  return result;
}